

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall LLVMBC::ModuleParseContext::add_value(ModuleParseContext *this,Value *value)

{
  uint64_t id;
  TypeID TVar1;
  Type *this_00;
  Value *local_18;
  Value *value_local;
  ModuleParseContext *this_local;
  
  local_18 = value;
  value_local = (Value *)this;
  this_00 = Value::getType(value);
  TVar1 = Type::getTypeID(this_00);
  if (TVar1 != VoidTyID) {
    id = this->tween_id;
    this->tween_id = id + 1;
    Value::set_tween_id(local_18,id);
    std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::push_back
              (&this->values,&local_18);
  }
  return true;
}

Assistant:

bool ModuleParseContext::add_value(Value *value)
{
	if (value->getType()->getTypeID() != Type::TypeID::VoidTyID)
	{
		value->set_tween_id(tween_id++);
		values.push_back(value);
	}
	return true;
}